

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O1

int shared_attach(int idx)

{
  SHARED_LTAB *pSVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = shared_mux(idx,1);
  if (iVar2 == 0) {
    iVar2 = shared_map(idx);
    if (iVar2 == 0) {
      iVar2 = shared_attach_process(shared_gt[idx].sem);
      pSVar1 = shared_lt;
      if (iVar2 == 0) {
        shared_lt[idx].tcnt = shared_lt[idx].tcnt + 1;
        iVar3 = 0;
        if ((shared_gt[idx].attr & 4U) != 0) {
          iVar2 = shmdt(pSVar1[idx].p);
          iVar3 = 0x9b;
          if (iVar2 == 0) {
            iVar3 = 0;
          }
          shared_lt[idx].p = (BLKHEAD *)0x0;
        }
        shared_lt[idx].seekpos = 0;
        iVar2 = shared_demux(idx,1);
        if (iVar3 != 0) {
          iVar2 = iVar3;
        }
      }
      else {
        shmdt(shared_lt[idx].p);
        shared_lt[idx].p = (BLKHEAD *)0x0;
        shared_demux(idx,1);
        iVar2 = 0x97;
      }
    }
    else {
      shared_demux(idx,1);
    }
  }
  return iVar2;
}

Assistant:

int     shared_attach(int idx)
 { int r, r2;

   if (SHARED_OK != (r = shared_mux(idx, SHARED_RDWRITE | SHARED_WAIT))) return(r);
   if (SHARED_OK != (r = shared_map(idx)))
     { shared_demux(idx, SHARED_RDWRITE);
       return(r);
     }
   if (shared_attach_process(shared_gt[idx].sem))       /* try attach process */
     { shmdt((char *)(shared_lt[idx].p));               /* cannot attach process, detach everything */
       shared_lt[idx].p = NULL;
       shared_demux(idx, SHARED_RDWRITE);
       return(SHARED_BADARG);
     }
   shared_lt[idx].tcnt++;                               /* one more thread is using segment */
   if (shared_gt[idx].attr & SHARED_RESIZE)             /* if resizeable, detach and return special pointer */
     { if (shmdt((char *)(shared_lt[idx].p))) r = SHARED_IPCERR;  /* if segment is resizable, then detach segment */
       shared_lt[idx].p = NULL;
     }
   shared_lt[idx].seekpos = 0L;                         /* r/w pointer positioned at beg of block */
   r2 = shared_demux(idx, SHARED_RDWRITE);
   return(r ? r : r2);
 }